

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O0

bool cmFortranStreamContainsSequence(istream *ifs,char *seq,int len)

{
  int iVar1;
  ulong uVar2;
  int local_28;
  int token;
  int cur;
  int len_local;
  char *seq_local;
  istream *ifs_local;
  
  if (len < 1) {
    __assert_fail("len > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmDependsFortran.cxx"
                  ,0x21e,"bool cmFortranStreamContainsSequence(std::istream &, const char *, int)");
  }
  local_28 = 0;
  while( true ) {
    if (len <= local_28) {
      return true;
    }
    iVar1 = std::istream::get();
    uVar2 = std::ios::operator!((ios *)(ifs + *(long *)(*(long *)ifs + -0x18)));
    if ((uVar2 & 1) != 0) break;
    if (iVar1 == seq[local_28]) {
      local_28 = local_28 + 1;
    }
    else {
      local_28 = 0;
    }
  }
  return false;
}

Assistant:

static bool cmFortranStreamContainsSequence(std::istream& ifs, const char* seq,
                                            int len)
{
  assert(len > 0);

  int cur = 0;
  while (cur < len) {
    // Get the next character.
    int token = ifs.get();
    if (!ifs) {
      return false;
    }

    // Check the character.
    if (token == static_cast<int>(seq[cur])) {
      ++cur;
    } else {
      // Assume the sequence has no repeating subsequence.
      cur = 0;
    }
  }

  // The entire sequence was matched.
  return true;
}